

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_inverse_field(secp256k1_fe *out,secp256k1_fe *x,int var)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int iVar59;
  undefined4 uVar60;
  uint uVar61;
  uint extraout_EAX;
  uint32_t uVar62;
  int extraout_EDX;
  long *extraout_RDX;
  long lVar63;
  code *pcVar64;
  secp256k1_fe *psVar65;
  secp256k1_fe *a;
  long lVar66;
  ulong uVar67;
  secp256k1_fe *r;
  secp256k1_fe *size;
  secp256k1_fe *psVar68;
  uchar *__s;
  ulong uVar69;
  ulong uVar70;
  size_t count;
  ulong uVar71;
  secp256k1_fe *r_00;
  code *pcVar72;
  uint extraout_XMM0_Da;
  uint uVar73;
  uint extraout_XMM0_Db;
  uint uVar74;
  uint extraout_XMM0_Dc;
  uint uVar75;
  uint extraout_XMM0_Dd;
  uint uVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  secp256k1_fe t;
  ulong uStack_1278;
  secp256k1_fe *psStack_1270;
  uchar auStack_1268 [4232];
  secp256k1_fe *psStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  secp256k1_fe *psStack_1c8;
  code *pcStack_1c0;
  code *pcStack_1b8;
  undefined1 auStack_1b0 [32];
  undefined1 auStack_190 [40];
  long lStack_168;
  long lStack_160;
  long lStack_158;
  secp256k1_fe *psStack_150;
  secp256k1_fe *psStack_148;
  code *pcStack_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  ulong local_118;
  undefined8 local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  secp256k1_fe local_d0;
  code *local_a8;
  secp256k1_fe *local_a0;
  undefined8 local_98;
  ulong local_90;
  secp256k1_fe local_88;
  secp256k1_fe local_58;
  
  pcVar64 = secp256k1_fe_impl_inv_var;
  if (var == 0) {
    pcVar64 = secp256k1_fe_impl_inv;
  }
  pcStack_140 = (code *)0x1628ce;
  (*pcVar64)(&local_d0);
  if (out != (secp256k1_fe *)0x0) {
    out->n[4] = local_d0.n[4];
    out->n[2] = local_d0.n[2];
    out->n[3] = local_d0.n[3];
    out->n[0] = local_d0.n[0];
    out->n[1] = local_d0.n[1];
  }
  local_88.n[4] = x->n[4];
  local_88.n[0] = x->n[0];
  local_88.n[1] = x->n[1];
  local_88.n[2] = x->n[2];
  local_88.n[3] = x->n[3];
  pcStack_140 = (code *)0x16291b;
  iVar59 = secp256k1_fe_impl_normalizes_to_zero_var(&local_88);
  if (iVar59 != 0) {
    pcStack_140 = (code *)0x162929;
    iVar59 = secp256k1_fe_impl_normalizes_to_zero(&local_d0);
    if (iVar59 != 0) {
      return;
    }
    pcStack_140 = (code *)0x162936;
    test_inverse_field_cold_1();
  }
  uVar69 = x->n[0];
  local_e0 = x->n[1];
  local_100 = x->n[2];
  local_f0 = x->n[3];
  local_118 = local_d0.n[3];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_d0.n[3];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar69;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_d0.n[2];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_e0;
  local_f8 = x->n[4];
  local_108 = local_d0.n[0];
  local_d8 = local_d0.n[1];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_d0.n[1];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_100;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_d0.n[0];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_f0;
  local_e8 = local_d0.n[4];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_d0.n[4];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_f8;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SUB168(auVar5 * auVar34,0);
  auVar1 = auVar2 * auVar31 + auVar1 * auVar30 + auVar3 * auVar32 + auVar4 * auVar33 +
           auVar6 * ZEXT816(0x1000003d10);
  local_90 = auVar1._0_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_d0.n[4];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar69;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_d0.n[3];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_e0;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_d0.n[2];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_100;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_d0.n[1];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_f0;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_d0.n[0];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_f8;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = SUB168(auVar5 * auVar34,8);
  auVar1 = auVar12 * ZEXT816(0x1000003d10000) +
           auVar11 * auVar39 + auVar10 * auVar38 + auVar9 * auVar37 + auVar8 * auVar36 +
           auVar7 * auVar35 + (auVar1 >> 0x34);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_d0.n[0];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar69;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_d0.n[4];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = local_e0;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_d0.n[3];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = local_100;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_d0.n[2];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = local_f0;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_d0.n[1];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = local_f8;
  auVar2 = auVar17 * auVar44 + auVar16 * auVar43 + auVar15 * auVar42 + auVar14 * auVar41 +
           (auVar1 >> 0x34);
  auVar3 = auVar2 >> 0x34;
  local_110 = auVar3._8_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = (auVar2._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
  auVar2 = auVar18 * ZEXT816(0x1000003d1) + auVar13 * auVar40;
  uVar71 = auVar2._0_8_;
  uVar67 = auVar2._8_8_;
  local_138._8_8_ = 0;
  local_138._0_8_ = local_d0.n[1];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar69;
  local_138 = local_138 * auVar45;
  auVar55._8_8_ = uVar67 >> 0x34;
  auVar55._0_8_ = uVar67 * 0x1000 | uVar71 >> 0x34;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_d0.n[0];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = local_e0;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_d0.n[4];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_100;
  local_98 = SUB168(auVar20 * auVar47,8);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_d0.n[3];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = local_f0;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_d0.n[2];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_f8;
  auVar3 = auVar3 + auVar20 * auVar47 + auVar22 * auVar49 + auVar21 * auVar48;
  uVar70 = auVar3._0_8_;
  uVar67 = auVar3._8_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar70 & 0xfffffffffffff;
  auVar55 = auVar23 * ZEXT816(0x1000003d10) + auVar19 * auVar46 + local_138 + auVar55;
  uVar70 = uVar67 * 0x1000 | uVar70 >> 0x34;
  auVar56._8_8_ = uVar67 >> 0x34;
  auVar56._0_8_ = uVar70;
  local_128._8_8_ = 0;
  local_128._0_8_ = local_d0.n[2];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar69;
  local_128 = local_128 * auVar50;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_d0.n[1];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_e0;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_d0.n[0];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = local_100;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_d0.n[4];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_f0;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_d0.n[3];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_f8;
  auVar56 = auVar27 * auVar54 + auVar26 * auVar53 + auVar56;
  psVar65 = (secp256k1_fe *)0xffffffffffff;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = auVar56._0_8_;
  auVar2 = auVar28 * ZEXT816(0x1000003d10) + auVar25 * auVar52 + auVar24 * auVar51 + local_128 +
           (auVar55 >> 0x34);
  auVar3 = auVar2 >> 0x34;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = auVar3._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = auVar56._8_8_;
  auVar57._8_8_ = auVar3._8_8_;
  auVar57._0_8_ = local_90 & 0xfffffffffffff;
  auVar58 = auVar29 * ZEXT816(0x1000003d10000) + auVar57 + auVar58;
  uVar69 = auVar58._0_8_;
  r_00 = (secp256k1_fe *)((uVar71 & 0xfffffffffffff) + 0xffffefffffc2e);
  r = &local_88;
  pcVar72 = (code *)((auVar55._0_8_ & 0xfffffffffffff) + 0xfffffffffffff);
  local_88.n[2] = (auVar2._0_8_ & 0xfffffffffffff) + 0xfffffffffffff;
  local_88.n[3] = (uVar69 & 0xfffffffffffff) + 0xfffffffffffff;
  a = (secp256k1_fe *)
      ((auVar1._0_8_ & 0xffffffffffff) + 0xffffffffffff + (auVar58._8_8_ << 0xc | uVar69 >> 0x34));
  pcStack_140 = (code *)0x162d56;
  local_a8 = pcVar64;
  local_a0 = x;
  local_88.n[0] = (uint64_t)r_00;
  local_88.n[1] = (uint64_t)pcVar72;
  local_88.n[4] = (uint64_t)a;
  iVar59 = secp256k1_fe_impl_normalizes_to_zero(r);
  if (iVar59 == 0) {
    pcStack_140 = (code *)0x162e6a;
    test_inverse_field_cold_3();
  }
  else {
    local_58.n[0] = local_a0->n[0] + 0xffffefffffc2e;
    local_58.n[1] = local_a0->n[1] + 0xfffffffffffff;
    local_58.n[2] = local_a0->n[2] + 0xfffffffffffff;
    local_58.n[3] = local_a0->n[3] + 0xfffffffffffff;
    local_58.n[4] = local_a0->n[4] + 0xffffffffffff;
    pcStack_140 = (code *)0x162db4;
    iVar59 = secp256k1_fe_impl_normalizes_to_zero_var(&local_58);
    pcVar72 = local_a8;
    if (iVar59 != 0) {
      return;
    }
    psVar65 = &local_58;
    pcStack_140 = (code *)0x162dd5;
    (*local_a8)(psVar65,psVar65);
    r_00 = &local_d0;
    local_d0.n[0] = local_d0.n[0] + 0xffffefffffc2e;
    local_d0.n[1] = local_d0.n[1] + 0xfffffffffffff;
    local_d0.n[2] = local_d0.n[2] + 0xfffffffffffff;
    local_d0.n[3] = local_d0.n[3] + 0xfffffffffffff;
    local_d0.n[4] = local_d0.n[4] + 0xffffffffffff;
    pcStack_140 = (code *)0x162e0e;
    a = r_00;
    (*pcVar72)(r_00);
    local_d0.n[0] = local_d0.n[0] + local_58.n[0] + 1;
    local_d0.n[1] = local_d0.n[1] + local_58.n[1];
    local_d0.n[2] = local_d0.n[2] + local_58.n[2];
    local_d0.n[3] = local_d0.n[3] + local_58.n[3];
    local_d0.n[4] = local_d0.n[4] + local_58.n[4];
    pcStack_140 = (code *)0x162e4f;
    r = r_00;
    iVar59 = secp256k1_fe_impl_normalizes_to_zero_var(r_00);
    if (iVar59 != 0) {
      return;
    }
  }
  pcStack_140 = test_inverse_scalar;
  test_inverse_field_cold_2();
  size = (secp256k1_fe *)auStack_1b0;
  psVar68 = (secp256k1_fe *)auStack_1b0;
  pcVar64 = secp256k1_scalar_inverse_var;
  if (extraout_EDX == 0) {
    pcVar64 = secp256k1_scalar_inverse;
  }
  pcStack_1b8 = (code *)0x162e98;
  psStack_150 = psVar65;
  psStack_148 = r_00;
  pcStack_140 = pcVar72;
  uVar60 = (*pcVar64)();
  if (r != (secp256k1_fe *)0x0) {
    r->n[2] = CONCAT44(auStack_1b0._20_4_,auStack_1b0._16_4_);
    r->n[3] = CONCAT44(auStack_1b0._28_4_,auStack_1b0._24_4_);
    r->n[0] = CONCAT44(auStack_1b0._4_4_,auStack_1b0._0_4_);
    r->n[1] = CONCAT44(auStack_1b0._12_4_,auStack_1b0._8_4_);
  }
  uVar73 = 0;
  uVar74 = 0;
  uVar75 = 0;
  uVar76 = 0;
  auVar77._0_4_ = -(uint)((int)a->n[2] == 0 && (int)a->n[0] == 0);
  auVar77._4_4_ = -(uint)(*(int *)((long)a->n + 0x14) == 0 && *(int *)((long)a->n + 4) == 0);
  auVar77._8_4_ = -(uint)((int)a->n[3] == 0 && (int)a->n[1] == 0);
  auVar77._12_4_ = -(uint)(*(int *)((long)a->n + 0x1c) == 0 && *(int *)((long)a->n + 0xc) == 0);
  uVar61 = movmskps(uVar60,auVar77);
  uVar61 = uVar61 ^ 0xf;
  if (uVar61 != 0) {
    r = (secp256k1_fe *)(auStack_190 + 0x20);
    pcStack_1b8 = (code *)0x162ee3;
    size = r;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r,(secp256k1_scalar *)a,(secp256k1_scalar *)auStack_1b0);
    if (((auStack_190._32_8_ != 1 || lStack_168 != 0) || lStack_160 != 0) || lStack_158 != 0) {
      pcStack_1b8 = (code *)0x162fd0;
      test_inverse_scalar_cold_1();
      goto LAB_00162fd0;
    }
    pcStack_1b8 = (code *)0x162f13;
    iVar59 = secp256k1_scalar_add
                       ((secp256k1_scalar *)auStack_190,(secp256k1_scalar *)a,&scalar_minus_one);
    auVar78._0_4_ = -(uint)(auStack_190._16_4_ == 0 && auStack_190._0_4_ == 0);
    auVar78._4_4_ = -(uint)(auStack_190._20_4_ == 0 && auStack_190._4_4_ == 0);
    auVar78._8_4_ = -(uint)(auStack_190._24_4_ == 0 && auStack_190._8_4_ == 0);
    auVar78._12_4_ = -(uint)(auStack_190._28_4_ == 0 && auStack_190._12_4_ == 0);
    iVar59 = movmskps(iVar59,auVar78);
    if (iVar59 == 0xf) {
      return;
    }
    a = (secp256k1_fe *)auStack_190;
    pcStack_1b8 = (code *)0x162f44;
    (*pcVar64)(a,a);
    pcStack_1b8 = (code *)0x162f59;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_1b0,&scalar_minus_one,(secp256k1_scalar *)auStack_1b0);
    pcStack_1b8 = (code *)0x162f62;
    (*pcVar64)(auStack_1b0,auStack_1b0);
    pcStack_1b8 = (code *)0x162f74;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_1b0,(secp256k1_scalar *)auStack_1b0,&secp256k1_scalar_one
              );
    pcStack_1b8 = (code *)0x162f82;
    iVar59 = secp256k1_scalar_add
                       ((secp256k1_scalar *)auStack_1b0,(secp256k1_scalar *)a,
                        (secp256k1_scalar *)auStack_1b0);
    auVar79._0_4_ = -(uint)(auStack_1b0._16_4_ == 0 && auStack_1b0._0_4_ == 0);
    auVar79._4_4_ = -(uint)(auStack_1b0._20_4_ == 0 && auStack_1b0._4_4_ == 0);
    auVar79._8_4_ = -(uint)(auStack_1b0._24_4_ == 0 && auStack_1b0._8_4_ == 0);
    auVar79._12_4_ = -(uint)(auStack_1b0._28_4_ == 0 && auStack_1b0._12_4_ == 0);
    iVar59 = movmskps(iVar59,auVar79);
    if (iVar59 == 0xf) {
      return;
    }
    pcStack_1b8 = (code *)0x162fa6;
    test_inverse_scalar_cold_2();
    size = psVar68;
    r = (secp256k1_fe *)auStack_1b0;
    uVar61 = extraout_EAX;
    uVar73 = extraout_XMM0_Da;
    uVar74 = extraout_XMM0_Db;
    uVar75 = extraout_XMM0_Dc;
    uVar76 = extraout_XMM0_Dd;
  }
  auVar80._0_4_ = -(uint)((auStack_1b0._16_4_ | auStack_1b0._0_4_) == uVar73);
  auVar80._4_4_ = -(uint)((auStack_1b0._20_4_ | auStack_1b0._4_4_) == uVar74);
  auVar80._8_4_ = -(uint)((auStack_1b0._24_4_ | auStack_1b0._8_4_) == uVar75);
  auVar80._12_4_ = -(uint)((auStack_1b0._28_4_ | auStack_1b0._12_4_) == uVar76);
  iVar59 = movmskps(uVar61,auVar80);
  if (iVar59 == 0xf) {
    return;
  }
LAB_00162fd0:
  pcStack_1b8 = test_hsort;
  test_inverse_scalar_cold_3();
  uStack_1d8 = 0xffffefffffc2e;
  __s = auStack_1268;
  psStack_1e0 = a;
  uStack_1d0 = SUB168(auVar25 * auVar52,0);
  psStack_1c8 = r;
  pcStack_1c0 = pcVar64;
  pcStack_1b8 = (code *)uVar70;
  memset(__s,0,0x1081);
  uStack_1278 = 0;
  lVar66 = 0x41;
  psStack_1270 = size;
  secp256k1_hsort(__s,0x41,(size_t)size,test_hsort_cmp,&uStack_1278);
  if (0x3f < uStack_1278) {
    test_hsort_is_sorted(auStack_1268,0x41,(size_t)size);
    if (0 < COUNT) {
      iVar59 = 0;
      do {
        uVar62 = testrand_int(0x41);
        count = (size_t)(int)uVar62;
        testrand_bytes_test(auStack_1268,count * (long)size);
        secp256k1_hsort(auStack_1268,count,(size_t)size,test_hsort_cmp,&uStack_1278);
        test_hsort_is_sorted(auStack_1268,count,(size_t)size);
        iVar59 = iVar59 + 1;
      } while (iVar59 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX = *extraout_RDX + 1;
  if (extraout_RDX[1] != 0) {
    lVar63 = 0;
    do {
      if (__s[lVar63] != *(uchar *)(lVar66 + lVar63)) {
        return;
      }
      lVar63 = lVar63 + 1;
    } while (extraout_RDX[1] != lVar63);
  }
  return;
}

Assistant:

static void test_inverse_field(secp256k1_fe* out, const secp256k1_fe* x, int var)
{
    secp256k1_fe l, r, t;

    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&l, x) ;   /* l = 1/x */
    if (out) *out = l;
    t = *x;                                                    /* t = x */
    if (secp256k1_fe_normalizes_to_zero_var(&t)) {
        CHECK(secp256k1_fe_normalizes_to_zero(&l));
        return;
    }
    secp256k1_fe_mul(&t, x, &l);                               /* t = x*(1/x) */
    secp256k1_fe_add(&t, &fe_minus_one);                       /* t = x*(1/x)-1 */
    CHECK(secp256k1_fe_normalizes_to_zero(&t));                /* x*(1/x)-1 == 0 */
    r = *x;                                                    /* r = x */
    secp256k1_fe_add(&r, &fe_minus_one);                       /* r = x-1 */
    if (secp256k1_fe_normalizes_to_zero_var(&r)) return;
    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&r, &r);   /* r = 1/(x-1) */
    secp256k1_fe_add(&l, &fe_minus_one);                       /* l = 1/x-1 */
    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&l, &l);   /* l = 1/(1/x-1) */
    secp256k1_fe_add_int(&l, 1);                               /* l = 1/(1/x-1)+1 */
    secp256k1_fe_add(&l, &r);                                  /* l = 1/(1/x-1)+1 + 1/(x-1) */
    CHECK(secp256k1_fe_normalizes_to_zero_var(&l));            /* l == 0 */
}